

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

void ReadFromStream(AddrMan *addr,DataStream *ssPeers)

{
  long lVar1;
  bool bVar2;
  CChainParams *pCVar3;
  runtime_error *this;
  long in_FS_OFFSET;
  MessageStartChars pchMsgTmp;
  HashVerifier<DataStream> verifier;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256((CSHA256 *)&verifier);
  verifier.m_source = ssPeers;
  Unserialize<HashVerifier<DataStream>,_unsigned_char,_4UL>(&verifier,&pchMsgTmp);
  pCVar3 = Params();
  bVar2 = std::operator==(&pchMsgTmp,&pCVar3->pchMessageStart);
  if (bVar2) {
    AddrMan::Unserialize<HashVerifier<DataStream>>(addr,&verifier);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Invalid network magic number");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void ReadFromStream(AddrMan& addr, DataStream& ssPeers)
{
    DeserializeDB(ssPeers, addr, false);
}